

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall hgdb::json::Module::serialize_(Module *this,JSONWriter *w)

{
  pointer pvVar1;
  JSONWriter *pJVar2;
  variant_alternative_t<1UL,_variant<Variable,_unsigned_long>_> *pvVar3;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *this_00;
  pointer ppVar4;
  variant<hgdb::json::Variable,_unsigned_long> *v;
  pointer __v;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pointer local_40;
  Module *local_38;
  
  name._M_str = "name";
  name._M_len = 4;
  pJVar2 = JSONWriter::key(w,name);
  std::__cxx11::string::string((string *)&local_80,(string *)&this->name_);
  JSONWriter::value<std::__cxx11::string>(pJVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  name_00._M_str = "instances";
  name_00._M_len = 9;
  pJVar2 = JSONWriter::key(w,name_00);
  JSONWriter::begin_array(pJVar2);
  local_40 = (this->instances_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  for (ppVar4 = (this->instances_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != local_40; ppVar4 = ppVar4 + 1)
  {
    pJVar2 = JSONWriter::begin_obj(w);
    name_01._M_str = "name";
    name_01._M_len = 4;
    pJVar2 = JSONWriter::key(pJVar2,name_01);
    std::__cxx11::string::string((string *)&local_c0,(string *)ppVar4);
    pJVar2 = JSONWriter::value<std::__cxx11::string>(pJVar2,&local_c0);
    name_02._M_str = "module";
    name_02._M_len = 6;
    pJVar2 = JSONWriter::key(pJVar2,name_02);
    std::__cxx11::string::string((string *)&local_60,(string *)&ppVar4->second->name_);
    pJVar2 = JSONWriter::value<std::__cxx11::string>(pJVar2,&local_60);
    JSONWriter::end_obj(pJVar2);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  JSONWriter::end_array(w);
  name_03._M_str = "variables";
  name_03._M_len = 9;
  pJVar2 = JSONWriter::key(w,name_03);
  JSONWriter::begin_array(pJVar2);
  pvVar1 = (local_38->variables_).
           super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__v = (local_38->variables_).
             super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __v != pvVar1; __v = __v + 1) {
    if ((__v->super__Variant_base<hgdb::json::Variable,_unsigned_long>).
        super__Move_assign_alias<hgdb::json::Variable,_unsigned_long>.
        super__Copy_assign_alias<hgdb::json::Variable,_unsigned_long>.
        super__Move_ctor_alias<hgdb::json::Variable,_unsigned_long>.
        super__Copy_ctor_alias<hgdb::json::Variable,_unsigned_long>.
        super__Variant_storage_alias<hgdb::json::Variable,_unsigned_long>._M_index == '\0') {
      this_00 = std::get<0ul,hgdb::json::Variable,unsigned_long>(__v);
      Variable::serialize(this_00,w);
    }
    else {
      pvVar3 = std::get<1ul,hgdb::json::Variable,unsigned_long>(__v);
      std::__cxx11::to_string(&local_a0,*pvVar3);
      JSONWriter::value<std::__cxx11::string>(w,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  JSONWriter::end_array(w);
  return;
}

Assistant:

void serialize_(JSONWriter &w) const override {
        w.key("name").value(name_);
        w.key("instances").begin_array();
        for (auto const &[name, m] : instances_) {
            w.begin_obj().key("name").value(name).key("module").value(m->name_).end_obj();
        }
        w.end_array();
        w.key("variables").begin_array();
        for (auto const &v : variables_) {
            if (v.index() == 0) {
                std::get<0>(v).serialize(w);
            } else {
                w.value(std::to_string(std::get<1>(v)));
            }
        }
        w.end_array();
    }